

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_3::TextureFilteringTestInstance::runTest
          (TestStatus *__return_storage_ptr__,TextureFilteringTestInstance *this)

{
  Context *ctx;
  bool bVar1;
  deBool dVar2;
  uint uVar3;
  int iVar4;
  NotSupportedError *this_00;
  DataGenerator *pDVar5;
  TestError *this_01;
  size_type sVar6;
  Handle<(vk::HandleType)9> *pHVar7;
  reference pba;
  TestContext *pTVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  deUint64 siglen;
  uchar *sig;
  EVP_PKEY_CTX *ctx_00;
  uchar *in_R8;
  size_t in_R9;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  unsigned_long local_3a8;
  MessageBuilder local_3a0;
  byte local_219;
  unsigned_long uStack_218;
  bool result;
  MessageBuilder local_210;
  deUint64 local_90;
  deUint64 endTime;
  deUint64 startTime;
  VkImage local_60;
  vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_> local_58;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_40;
  TextureFilteringTestInstance *local_18;
  TextureFilteringTestInstance *this_local;
  
  local_18 = this;
  this_local = (TextureFilteringTestInstance *)__return_storage_ptr__;
  bVar1 = isSupported(this);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Unsupported combination of filtering and image format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringExplicitLodTests.cpp"
               ,0x2c5);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  while (dVar2 = ::deGetFalse(), dVar2 == 0) {
    pDVar5 = de::details::
             UniqueBase<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
             ::operator->(&(this->m_gen).
                           super_UniqueBase<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
                         );
    uVar3 = (*pDVar5->_vptr_DataGenerator[2])();
    if ((uVar3 & 1) == 0) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pDVar5 = de::details::
               UniqueBase<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
               ::operator->(&(this->m_gen).
                             super_UniqueBase<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
                           );
      (*pDVar5->_vptr_DataGenerator[3])();
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      operator=(&this->m_levels,&local_40);
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~vector(&local_40);
      pDVar5 = de::details::
               UniqueBase<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
               ::operator->(&(this->m_gen).
                             super_UniqueBase<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
                           );
      (*pDVar5->_vptr_DataGenerator[4])();
      std::vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>::
      operator=(&this->m_sampleArguments,&local_58);
      std::vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>::
      ~vector(&local_58);
      sVar6 = std::
              vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
              ::size(&this->m_sampleArguments);
      this->m_numSamples = (deUint32)sVar6;
      createResources(this);
      ctx = (this->super_TestInstance).m_context;
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::get
                         (&(this->m_im).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
      local_60.m_internal = pHVar7->m_internal;
      pba = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
            operator[](&this->m_levels,0);
      ImageViewParameters::ImageViewParameters((ImageViewParameters *)&startTime,&this->m_imParams);
      initializeImage(ctx,local_60,pba,(ImageViewParameters *)&startTime);
      endTime = deGetMicroseconds();
      execute(this);
      local_90 = deGetMicroseconds();
      pTVar8 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar9 = tcu::TestContext::getLog(pTVar8);
      tcu::TestLog::operator<<(&local_210,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [17])"Execution time: ");
      uStack_218 = local_90 - endTime;
      siglen = endTime;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&stack0xfffffffffffffde8);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x1315017);
      ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_210);
      endTime = deGetMicroseconds();
      iVar4 = verify(this,ctx_00,sig,siglen,in_R8,in_R9);
      local_219 = (byte)iVar4;
      local_90 = deGetMicroseconds();
      pTVar8 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar9 = tcu::TestContext::getLog(pTVar8);
      tcu::TestLog::operator<<(&local_3a0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_3a0,(char (*) [20])"Verification time: ");
      local_3a8 = local_90 - endTime;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3a8);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x1315017);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a0);
      if ((local_219 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"Verification failed",&local_3f1);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"Success",&local_3c9);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator(&local_3c9);
      }
      return __return_storage_ptr__;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"m_gen->generate()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringExplicitLodTests.cpp"
             ,0x2c7);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

TestStatus TextureFilteringTestInstance::runTest (void)
{
	if (!isSupported())
	    TCU_THROW(NotSupportedError, "Unsupported combination of filtering and image format");

	TCU_CHECK(m_gen->generate());
	m_levels = m_gen->getPba();

	m_sampleArguments = m_gen->getSampleArgs();
	m_numSamples = (deUint32)m_sampleArguments.size();

	createResources();
	initializeImage(m_context, m_im.get(), &m_levels[0], m_imParams);

	deUint64 startTime, endTime;

	startTime = deGetMicroseconds();
	execute();
	endTime = deGetMicroseconds();

	m_context.getTestContext().getLog() << TestLog::Message
										<< "Execution time: "
										<< endTime - startTime
										<< "us"
										<< TestLog::EndMessage;

    startTime = deGetMicroseconds();
	bool result = verify();
    endTime = deGetMicroseconds();

	m_context.getTestContext().getLog() << TestLog::Message
										<< "Verification time: "
										<< endTime - startTime
										<< "us"
										<< TestLog::EndMessage;

	if (result)
	{
		return TestStatus::pass("Success");
	}
	else
	{
		// \todo [2016-06-24 collinbaker] Print report if verification fails
		return TestStatus::fail("Verification failed");
	}
}